

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall inja::Parser::parse_into(Parser *this,Template *tmpl,path *path)

{
  Token *this_00;
  BlockNode *pBVar1;
  char *pcVar2;
  pointer pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  size_t sVar6;
  bool bVar7;
  long *plVar8;
  ParserError *pPVar9;
  long *plVar10;
  element_type *peVar11;
  Lexer *this_01;
  Token *pTVar12;
  SourceLocation SVar13;
  string_view input;
  shared_ptr<inja::ExpressionListNode> expression_list_node;
  undefined1 local_c0 [32];
  Lexer *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string local_78;
  shared_ptr<inja::ExpressionListNode> local_58;
  path *local_48;
  Token *local_40;
  _func_int **local_38;
  
  this_01 = &this->lexer;
  input._M_str = (tmpl->content)._M_dataplus._M_p;
  input._M_len = (tmpl->content)._M_string_length;
  local_48 = path;
  Lexer::start(this_01,input);
  this->current_block = &tmpl->root;
  this_00 = &this->tok;
  local_40 = &this->peek_tok;
  pTVar12 = local_40;
  local_a0 = this_01;
  do {
    if (this->have_peek_tok == true) {
      (this->tok).text._M_str = (pTVar12->text)._M_str;
      uVar4 = *(undefined4 *)&pTVar12->field_0x4;
      sVar6 = (pTVar12->text)._M_len;
      uVar5 = *(undefined4 *)((long)&(pTVar12->text)._M_len + 4);
      this_00->kind = pTVar12->kind;
      *(undefined4 *)&(this->tok).field_0x4 = uVar4;
      *(int *)&(this->tok).text._M_len = (int)sVar6;
      *(undefined4 *)((long)&(this->tok).text._M_len + 4) = uVar5;
      this->have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)local_c0,this_01);
      (this->tok).text._M_str = (char *)local_c0._16_8_;
      this_00->kind = local_c0._0_4_;
      *(undefined4 *)&(this->tok).field_0x4 = local_c0._4_4_;
      *(undefined4 *)&(this->tok).text._M_len = local_c0._8_4_;
      *(undefined4 *)((long)&(this->tok).text._M_len + 4) = local_c0._12_4_;
    }
    switch(this_00->kind) {
    case Text:
      pBVar1 = this->current_block;
      local_38 = (_func_int **)(this->tok).text._M_len;
      pcVar2 = (this->tok).text._M_str;
      pcVar3 = (tmpl->content)._M_dataplus._M_p;
      local_c0._0_8_ = (element_type *)0x0;
      local_c0._8_8_ = operator_new(0x28);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1598;
      local_c0._0_8_ = local_c0._8_8_ + 0x10;
      *(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x10))->
                _M_use_count = (long)pcVar2 - (long)pcVar3;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)&PTR_accept_001b15e8;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x20))->
      _vptr__Sp_counted_base = local_38;
      ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
      emplace_back<std::shared_ptr<inja::TextNode>>
                ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  *)&pBVar1->nodes,(shared_ptr<inja::TextNode> *)local_c0);
      this_01 = local_a0;
      pTVar12 = local_40;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
        pTVar12 = local_40;
      }
      break;
    case ExpressionOpen:
      if (this->have_peek_tok == true) {
        (this->tok).text._M_str = (pTVar12->text)._M_str;
        uVar4 = *(undefined4 *)&pTVar12->field_0x4;
        sVar6 = (pTVar12->text)._M_len;
        this_00->kind = pTVar12->kind;
        *(undefined4 *)&this_00->field_0x4 = uVar4;
        (this->tok).text._M_len = sVar6;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)local_c0,this_01);
        (this->tok).text._M_str = (char *)local_c0._16_8_;
        *(undefined8 *)this_00 = local_c0._0_8_;
        (this->tok).text._M_len = local_c0._8_8_;
      }
      pcVar2 = (this->tok).text._M_str;
      pcVar3 = (tmpl->content)._M_dataplus._M_p;
      local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
      (local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count = 1;
      (local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_weak_count = 1;
      (local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1ab0;
      local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1);
      *(long *)&local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[1]._M_use_count = (long)pcVar2 - (long)pcVar3;
      local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR_accept_001b16d0;
      local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[2]._M_use_count = 0;
      local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[2]._M_weak_count = 0;
      ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
      emplace_back<std::shared_ptr<inja::ExpressionListNode>&>
                ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  *)&this->current_block->nodes,&local_58);
      this->current_expression_list =
           local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      bVar7 = parse_expression(this,tmpl,ExpressionClose);
      if (!bVar7) {
        Token::describe_abi_cxx11_(&local_78,this_00);
        plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x185675);
        local_98 = (long *)*plVar8;
        plVar10 = plVar8 + 2;
        if (local_98 == plVar10) {
          local_88 = *plVar10;
          lStack_80 = plVar8[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar10;
        }
        local_90 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)::std::__cxx11::string::append((char *)&local_98);
        local_c0._0_8_ = *plVar8;
        peVar11 = (element_type *)(plVar8 + 2);
        if ((element_type *)local_c0._0_8_ == peVar11) {
          local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
          local_c0._24_4_ = (undefined4)plVar8[3];
          local_c0._28_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
          local_c0._0_8_ = (element_type *)(local_c0 + 0x10);
        }
        else {
          local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
        }
        local_c0._8_8_ = plVar8[1];
        *plVar8 = (long)peVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        pPVar9 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar13 = Lexer::current_position(local_a0);
        ParserError::ParserError(pPVar9,(string *)local_c0,SVar13);
        __cxa_throw(pPVar9,&ParserError::typeinfo,InjaError::~InjaError);
      }
      if (local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      break;
    case LineStatementOpen:
      if (this->have_peek_tok == true) {
        (this->tok).text._M_str = (pTVar12->text)._M_str;
        uVar4 = *(undefined4 *)&pTVar12->field_0x4;
        sVar6 = (pTVar12->text)._M_len;
        this_00->kind = pTVar12->kind;
        *(undefined4 *)&this_00->field_0x4 = uVar4;
        (this->tok).text._M_len = sVar6;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)local_c0,this_01);
        (this->tok).text._M_str = (char *)local_c0._16_8_;
        *(undefined8 *)this_00 = local_c0._0_8_;
        (this->tok).text._M_len = local_c0._8_8_;
      }
      bVar7 = parse_statement(this,tmpl,LineStatementClose,local_48);
      if (!bVar7) {
        Token::describe_abi_cxx11_(&local_78,this_00);
        plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x185616);
        local_98 = (long *)*plVar8;
        plVar10 = plVar8 + 2;
        if (local_98 == plVar10) {
          local_88 = *plVar10;
          lStack_80 = plVar8[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar10;
        }
        local_90 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)::std::__cxx11::string::append((char *)&local_98);
        local_c0._0_8_ = *plVar8;
        peVar11 = (element_type *)(plVar8 + 2);
        if ((element_type *)local_c0._0_8_ == peVar11) {
          local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
          local_c0._24_4_ = (undefined4)plVar8[3];
          local_c0._28_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
          local_c0._0_8_ = (element_type *)(local_c0 + 0x10);
        }
        else {
          local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
        }
        local_c0._8_8_ = plVar8[1];
        *plVar8 = (long)peVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        pPVar9 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar13 = Lexer::current_position(local_a0);
        ParserError::ParserError(pPVar9,(string *)local_c0,SVar13);
        __cxa_throw(pPVar9,&ParserError::typeinfo,InjaError::~InjaError);
      }
      if ((this_00->kind != LineStatementClose) && (this_00->kind != Eof)) {
        Token::describe_abi_cxx11_(&local_78,this_00);
        plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x185650);
        local_98 = (long *)*plVar8;
        plVar10 = plVar8 + 2;
        if (local_98 == plVar10) {
          local_88 = *plVar10;
          lStack_80 = plVar8[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar10;
        }
        local_90 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)::std::__cxx11::string::append((char *)&local_98);
        local_c0._0_8_ = *plVar8;
        peVar11 = (element_type *)(plVar8 + 2);
        if ((element_type *)local_c0._0_8_ == peVar11) {
          local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
          local_c0._24_4_ = (undefined4)plVar8[3];
          local_c0._28_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
          local_c0._0_8_ = (element_type *)(local_c0 + 0x10);
        }
        else {
          local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
        }
        local_c0._8_8_ = plVar8[1];
        *plVar8 = (long)peVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        pPVar9 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar13 = Lexer::current_position(local_a0);
        ParserError::ParserError(pPVar9,(string *)local_c0,SVar13);
        __cxa_throw(pPVar9,&ParserError::typeinfo,InjaError::~InjaError);
      }
      break;
    case StatementOpen:
      if (this->have_peek_tok == true) {
        (this->tok).text._M_str = (pTVar12->text)._M_str;
        uVar4 = *(undefined4 *)&pTVar12->field_0x4;
        sVar6 = (pTVar12->text)._M_len;
        this_00->kind = pTVar12->kind;
        *(undefined4 *)&this_00->field_0x4 = uVar4;
        (this->tok).text._M_len = sVar6;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)local_c0,this_01);
        (this->tok).text._M_str = (char *)local_c0._16_8_;
        *(undefined8 *)this_00 = local_c0._0_8_;
        (this->tok).text._M_len = local_c0._8_8_;
      }
      bVar7 = parse_statement(this,tmpl,StatementClose,local_48);
      if (!bVar7) {
        Token::describe_abi_cxx11_(&local_78,this_00);
        plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x185616);
        local_98 = (long *)*plVar8;
        plVar10 = plVar8 + 2;
        if (local_98 == plVar10) {
          local_88 = *plVar10;
          lStack_80 = plVar8[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar10;
        }
        local_90 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)::std::__cxx11::string::append((char *)&local_98);
        local_c0._0_8_ = *plVar8;
        peVar11 = (element_type *)(plVar8 + 2);
        if ((element_type *)local_c0._0_8_ == peVar11) {
          local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
          local_c0._24_4_ = (undefined4)plVar8[3];
          local_c0._28_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
          local_c0._0_8_ = (element_type *)(local_c0 + 0x10);
        }
        else {
          local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
        }
        local_c0._8_8_ = plVar8[1];
        *plVar8 = (long)peVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        pPVar9 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar13 = Lexer::current_position(local_a0);
        ParserError::ParserError(pPVar9,(string *)local_c0,SVar13);
        __cxa_throw(pPVar9,&ParserError::typeinfo,InjaError::~InjaError);
      }
      if (this_00->kind != StatementClose) {
        Token::describe_abi_cxx11_(&local_78,this_00);
        plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x185630);
        local_98 = (long *)*plVar8;
        plVar10 = plVar8 + 2;
        if (local_98 == plVar10) {
          local_88 = *plVar10;
          lStack_80 = plVar8[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar10;
        }
        local_90 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)::std::__cxx11::string::append((char *)&local_98);
        local_c0._0_8_ = *plVar8;
        peVar11 = (element_type *)(plVar8 + 2);
        if ((element_type *)local_c0._0_8_ == peVar11) {
          local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
          local_c0._24_4_ = (undefined4)plVar8[3];
          local_c0._28_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
          local_c0._0_8_ = (element_type *)(local_c0 + 0x10);
        }
        else {
          local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
        }
        local_c0._8_8_ = plVar8[1];
        *plVar8 = (long)peVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        pPVar9 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar13 = Lexer::current_position(local_a0);
        ParserError::ParserError(pPVar9,(string *)local_c0,SVar13);
        __cxa_throw(pPVar9,&ParserError::typeinfo,InjaError::~InjaError);
      }
      break;
    case CommentOpen:
      if (this->have_peek_tok == true) {
        (this->tok).text._M_str = (pTVar12->text)._M_str;
        uVar4 = *(undefined4 *)&pTVar12->field_0x4;
        sVar6 = (pTVar12->text)._M_len;
        this_00->kind = pTVar12->kind;
        *(undefined4 *)&this_00->field_0x4 = uVar4;
        (this->tok).text._M_len = sVar6;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)local_c0,this_01);
        (this->tok).text._M_str = (char *)local_c0._16_8_;
        *(undefined8 *)this_00 = local_c0._0_8_;
        (this->tok).text._M_len = local_c0._8_8_;
      }
      if (this_00->kind != CommentClose) {
        Token::describe_abi_cxx11_(&local_78,this_00);
        plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x185696);
        local_98 = (long *)*plVar8;
        plVar10 = plVar8 + 2;
        if (local_98 == plVar10) {
          local_88 = *plVar10;
          lStack_80 = plVar8[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar10;
        }
        local_90 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)::std::__cxx11::string::append((char *)&local_98);
        local_c0._0_8_ = *plVar8;
        peVar11 = (element_type *)(plVar8 + 2);
        if ((element_type *)local_c0._0_8_ == peVar11) {
          local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
          local_c0._24_4_ = (undefined4)plVar8[3];
          local_c0._28_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
          local_c0._0_8_ = (element_type *)(local_c0 + 0x10);
        }
        else {
          local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
        }
        local_c0._8_8_ = plVar8[1];
        *plVar8 = (long)peVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        pPVar9 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar13 = Lexer::current_position(local_a0);
        ParserError::ParserError(pPVar9,(string *)local_c0,SVar13);
        __cxa_throw(pPVar9,&ParserError::typeinfo,InjaError::~InjaError);
      }
      break;
    default:
      if (this_00->kind == Eof) {
        if ((this->if_statement_stack).c.
            super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur !=
            (this->if_statement_stack).c.
            super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur) {
          local_c0._0_8_ = local_c0 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"unmatched if","");
          pPVar9 = (ParserError *)__cxa_allocate_exception(0x60);
          SVar13 = Lexer::current_position(local_a0);
          ParserError::ParserError(pPVar9,(string *)local_c0,SVar13);
          __cxa_throw(pPVar9,&ParserError::typeinfo,InjaError::~InjaError);
        }
        if ((this->for_statement_stack).c.
            super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur !=
            (this->for_statement_stack).c.
            super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur) {
          local_c0._0_8_ = local_c0 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"unmatched for","");
          pPVar9 = (ParserError *)__cxa_allocate_exception(0x60);
          SVar13 = Lexer::current_position(local_a0);
          ParserError::ParserError(pPVar9,(string *)local_c0,SVar13);
          __cxa_throw(pPVar9,&ParserError::typeinfo,InjaError::~InjaError);
        }
        this->current_block = (BlockNode *)0x0;
        return;
      }
    case ExpressionClose:
    case LineStatementClose:
    case StatementClose:
      Token::describe_abi_cxx11_(&local_78,this_00);
      plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x1856b4);
      local_98 = (long *)*plVar8;
      plVar10 = plVar8 + 2;
      if (local_98 == plVar10) {
        local_88 = *plVar10;
        lStack_80 = plVar8[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar10;
      }
      local_90 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)::std::__cxx11::string::append((char *)&local_98);
      local_c0._0_8_ = *plVar8;
      peVar11 = (element_type *)(plVar8 + 2);
      if ((element_type *)local_c0._0_8_ == peVar11) {
        local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
        local_c0._24_4_ = (undefined4)plVar8[3];
        local_c0._28_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
        local_c0._0_8_ = (element_type *)(local_c0 + 0x10);
      }
      else {
        local_c0._16_8_ = (peVar11->super_AstNode)._vptr_AstNode;
      }
      local_c0._8_8_ = plVar8[1];
      *plVar8 = (long)peVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      pPVar9 = (ParserError *)__cxa_allocate_exception(0x60);
      SVar13 = Lexer::current_position(local_a0);
      ParserError::ParserError(pPVar9,(string *)local_c0,SVar13);
      __cxa_throw(pPVar9,&ParserError::typeinfo,InjaError::~InjaError);
    }
  } while( true );
}

Assistant:

void parse_into(Template& tmpl, const std::filesystem::path& path) {
    lexer.start(tmpl.content);
    current_block = &tmpl.root;

    for (;;) {
      get_next_token();
      switch (tok.kind) {
      case Token::Kind::Eof: {
        if (!if_statement_stack.empty()) {
          throw_parser_error("unmatched if");
        }
        if (!for_statement_stack.empty()) {
          throw_parser_error("unmatched for");
        }
      }
        current_block = nullptr;
        return;
      case Token::Kind::Text: {
        current_block->nodes.emplace_back(std::make_shared<TextNode>(tok.text.data() - tmpl.content.c_str(), tok.text.size()));
      } break;
      case Token::Kind::StatementOpen: {
        get_next_token();
        if (!parse_statement(tmpl, Token::Kind::StatementClose, path)) {
          throw_parser_error("expected statement, got '" + tok.describe() + "'");
        }
        if (tok.kind != Token::Kind::StatementClose) {
          throw_parser_error("expected statement close, got '" + tok.describe() + "'");
        }
      } break;
      case Token::Kind::LineStatementOpen: {
        get_next_token();
        if (!parse_statement(tmpl, Token::Kind::LineStatementClose, path)) {
          throw_parser_error("expected statement, got '" + tok.describe() + "'");
        }
        if (tok.kind != Token::Kind::LineStatementClose && tok.kind != Token::Kind::Eof) {
          throw_parser_error("expected line statement close, got '" + tok.describe() + "'");
        }
      } break;
      case Token::Kind::ExpressionOpen: {
        get_next_token();

        auto expression_list_node = std::make_shared<ExpressionListNode>(tok.text.data() - tmpl.content.c_str());
        current_block->nodes.emplace_back(expression_list_node);
        current_expression_list = expression_list_node.get();

        if (!parse_expression(tmpl, Token::Kind::ExpressionClose)) {
          throw_parser_error("expected expression close, got '" + tok.describe() + "'");
        }
      } break;
      case Token::Kind::CommentOpen: {
        get_next_token();
        if (tok.kind != Token::Kind::CommentClose) {
          throw_parser_error("expected comment close, got '" + tok.describe() + "'");
        }
      } break;
      default: {
        throw_parser_error("unexpected token '" + tok.describe() + "'");
      } break;
      }
    }
    current_block = nullptr;
  }